

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaterialSystem.cpp
# Opt level: O0

aiReturn aiGetMaterialProperty
                   (aiMaterial *pMat,char *pKey,uint type,uint index,aiMaterialProperty **pPropOut)

{
  aiMaterialProperty *paVar1;
  int iVar2;
  aiMaterialProperty *prop;
  uint i;
  aiMaterialProperty **pPropOut_local;
  uint index_local;
  uint type_local;
  char *pKey_local;
  aiMaterial *pMat_local;
  
  if (pMat == (aiMaterial *)0x0) {
    __assert_fail("pMat != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Material/MaterialSystem.cpp"
                  ,0x42,
                  "aiReturn aiGetMaterialProperty(const aiMaterial *, const char *, unsigned int, unsigned int, const aiMaterialProperty **)"
                 );
  }
  if (pKey != (char *)0x0) {
    if (pPropOut == (aiMaterialProperty **)0x0) {
      __assert_fail("pPropOut != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Material/MaterialSystem.cpp"
                    ,0x44,
                    "aiReturn aiGetMaterialProperty(const aiMaterial *, const char *, unsigned int, unsigned int, const aiMaterialProperty **)"
                   );
    }
    prop._4_4_ = 0;
    while( true ) {
      if (pMat->mNumProperties <= prop._4_4_) {
        *pPropOut = (aiMaterialProperty *)0x0;
        return aiReturn_FAILURE;
      }
      paVar1 = pMat->mProperties[prop._4_4_];
      if ((((paVar1 != (aiMaterialProperty *)0x0) &&
           (iVar2 = strcmp((paVar1->mKey).data,pKey), iVar2 == 0)) &&
          ((type == 0xffffffff || (paVar1->mSemantic == type)))) &&
         ((index == 0xffffffff || (paVar1->mIndex == index)))) break;
      prop._4_4_ = prop._4_4_ + 1;
    }
    *pPropOut = pMat->mProperties[prop._4_4_];
    return aiReturn_SUCCESS;
  }
  __assert_fail("pKey != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Material/MaterialSystem.cpp"
                ,0x43,
                "aiReturn aiGetMaterialProperty(const aiMaterial *, const char *, unsigned int, unsigned int, const aiMaterialProperty **)"
               );
}

Assistant:

aiReturn aiGetMaterialProperty(const aiMaterial* pMat,
    const char* pKey,
    unsigned int type,
    unsigned int index,
    const aiMaterialProperty** pPropOut)
{
    ai_assert( pMat != NULL );
    ai_assert( pKey != NULL );
    ai_assert( pPropOut != NULL );

    /*  Just search for a property with exactly this name ..
     *  could be improved by hashing, but it's possibly
     *  no worth the effort (we're bound to C structures,
     *  thus std::map or derivates are not applicable. */
    for ( unsigned int i = 0; i < pMat->mNumProperties; ++i ) {
        aiMaterialProperty* prop = pMat->mProperties[i];

        if (prop /* just for safety ... */
            && 0 == strcmp( prop->mKey.data, pKey )
            && (UINT_MAX == type  || prop->mSemantic == type) /* UINT_MAX is a wild-card, but this is undocumented :-) */
            && (UINT_MAX == index || prop->mIndex == index))
        {
            *pPropOut = pMat->mProperties[i];
            return AI_SUCCESS;
        }
    }
    *pPropOut = NULL;
    return AI_FAILURE;
}